

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::DtlsSession::Write
          (Error *__return_storage_ptr__,DtlsSession *this,ByteArray *aBuf,MessageSubType aSubType)

{
  element_type *peVar1;
  const_reference buf;
  size_type sVar2;
  size_type sVar3;
  ByteArray *aBytes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar4;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  Error local_420;
  string local_3f8;
  void *local_3d8;
  DtlsSession *local_3d0;
  anon_class_1_0_00000001 local_3c2;
  v10 local_3c1;
  v10 *local_3c0;
  char *local_3b8;
  string local_3b0;
  allocator local_389;
  string local_388;
  size_type local_368;
  anon_class_1_0_00000001 local_35a;
  v10 local_359;
  v10 *local_358;
  char *local_350;
  string local_348;
  Error local_328;
  anon_class_1_0_00000001 local_2ea;
  v10 local_2e9;
  v10 *local_2e8;
  size_t local_2e0;
  string local_2d8;
  Error local_2b8;
  undefined1 local_289;
  int local_288;
  MessageSubType local_281;
  int rval;
  MessageSubType aSubType_local;
  ByteArray *aBuf_local;
  DtlsSession *this_local;
  Error *error;
  undefined1 local_250 [16];
  v10 *local_240;
  ulong local_238;
  v10 *local_230;
  size_t sStack_228;
  string *local_220;
  v10 *local_218;
  v10 **local_210;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int,_unsigned_long>
  local_208;
  undefined1 local_1e0 [16];
  v10 *local_1d0;
  char *local_1c8;
  size_type *local_1c0;
  v10 *local_1b8;
  v10 *local_1b0;
  char *pcStack_1a8;
  string *local_1a0;
  v10 *local_198;
  v10 **local_190;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188;
  undefined1 local_150 [16];
  v10 *local_140;
  char *local_138;
  string *local_130;
  void **local_128;
  v10 *local_120;
  v10 *local_118;
  char *pcStack_110;
  string *local_108;
  v10 *local_100;
  v10 **local_f8;
  v10 **local_f0;
  v10 *local_e8;
  size_t sStack_e0;
  Error **local_d0;
  undefined1 *local_c8;
  Error **local_c0;
  undefined8 local_b8;
  undefined1 *local_b0;
  Error **local_a8;
  v10 **local_a0;
  v10 *local_98;
  char *pcStack_90;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int,_unsigned_long>
  *local_80;
  undefined1 *local_78;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int,_unsigned_long>
  *local_70;
  undefined8 local_68;
  undefined1 *local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int,_unsigned_long>
  *local_58;
  v10 **local_50;
  v10 *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  local_288 = 0;
  local_289 = 0;
  local_281 = aSubType;
  _rval = (utils *)aBuf;
  aBuf_local = (ByteArray *)this;
  this_local = (DtlsSession *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  if (this->mState == kConnected) {
    peVar1 = std::
             __shared_ptr_access<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mSocket);
    Socket::SetSubType(peVar1,local_281);
    buf = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)_rval,0);
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)_rval);
    local_288 = mbedtls_ssl_write(&this->mSsl,buf,sVar2);
    peVar1 = std::
             __shared_ptr_access<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mSocket);
    Socket::SetSubType(peVar1,kNone);
    if (local_288 < 0) {
      ErrorFromMbedtlsError(&local_420,local_288);
      Error::operator=(__return_storage_ptr__,&local_420);
      Error::~Error(&local_420);
    }
    else {
      sVar2 = (size_type)local_288;
      sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)_rval);
      if (sVar2 == sVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_388,"dtls",&local_389);
        Write::anon_class_1_0_00000001::operator()(&local_3c2);
        local_f8 = &local_3c0;
        local_100 = &local_3c1;
        bVar4 = ::fmt::v10::operator()(local_100);
        local_3b8 = (char *)bVar4.size_;
        local_3c0 = (v10 *)bVar4.data_;
        ::fmt::v10::detail::
        check_format_string<void_*,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FMT_COMPILE_STRING,_0>
                  ();
        local_3d0 = this;
        local_3d8 = (void *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       _rval);
        utils::Hex_abi_cxx11_(&local_3f8,_rval,aBytes);
        local_108 = &local_3b0;
        local_118 = local_3c0;
        pcStack_110 = local_3b8;
        local_120 = (v10 *)&local_3d0;
        local_128 = &local_3d8;
        local_130 = &local_3f8;
        local_50 = &local_118;
        local_140 = local_3c0;
        local_138 = local_3b8;
        local_48 = local_140;
        pcStack_40 = local_138;
        ::fmt::v10::
        make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,void*,unsigned_long,std::__cxx11::string>
                  (&local_188,local_120,local_128,(unsigned_long *)local_130,in_R8);
        local_30 = local_150;
        local_38 = &local_188;
        local_18 = 0xd4e;
        args_01.field_1.values_ = in_R9.values_;
        args_01.desc_ = (unsigned_long_long)local_38;
        fmt_01.size_ = 0xd4e;
        fmt_01.data_ = local_138;
        local_28 = local_38;
        local_20 = local_38;
        local_10 = local_30;
        ::fmt::v10::vformat_abi_cxx11_(&local_3b0,local_140,fmt_01,args_01);
        Log(kDebug,&local_388,&local_3b0);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_3f8);
        std::__cxx11::string::~string((string *)&local_388);
        std::allocator<char>::~allocator((allocator<char> *)&local_389);
      }
      else {
        Write::anon_class_1_0_00000001::operator()(&local_35a);
        local_190 = &local_358;
        local_198 = &local_359;
        bVar4 = ::fmt::v10::operator()(local_198);
        local_350 = (char *)bVar4.size_;
        local_358 = (v10 *)bVar4.data_;
        ::fmt::v10::detail::check_format_string<int_&,_unsigned_long,_FMT_COMPILE_STRING,_0>();
        local_368 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)_rval);
        local_1a0 = &local_348;
        local_1b0 = local_358;
        pcStack_1a8 = local_350;
        local_1b8 = (v10 *)&local_288;
        local_1c0 = &local_368;
        local_a0 = &local_1b0;
        local_1d0 = local_358;
        local_1c8 = local_350;
        local_98 = local_1d0;
        pcStack_90 = local_1c8;
        ::fmt::v10::
        make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,int,unsigned_long>
                  (&local_208,local_1b8,(int *)local_1c0,(unsigned_long *)local_358);
        local_78 = local_1e0;
        local_80 = &local_208;
        local_68 = 0x41;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)local_80;
        fmt_00.size_ = 0x41;
        fmt_00.data_ = local_1c8;
        local_70 = local_80;
        local_60 = local_78;
        local_58 = local_80;
        ::fmt::v10::vformat_abi_cxx11_(&local_348,local_1d0,fmt_00,args_00);
        Error::Error(&local_328,kIOBusy,&local_348);
        Error::operator=(__return_storage_ptr__,&local_328);
        Error::~Error(&local_328);
        std::__cxx11::string::~string((string *)&local_348);
      }
    }
  }
  else {
    Write::anon_class_1_0_00000001::operator()(&local_2ea);
    local_210 = &local_2e8;
    local_218 = &local_2e9;
    bVar4 = ::fmt::v10::operator()(local_218);
    local_2e0 = bVar4.size_;
    local_2e8 = (v10 *)bVar4.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_220 = &local_2d8;
    local_230 = local_2e8;
    sStack_228 = local_2e0;
    local_f0 = &local_230;
    local_240 = local_2e8;
    local_238 = local_2e0;
    local_e8 = local_240;
    sStack_e0 = local_238;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_c8 = local_250;
    local_d0 = &error;
    local_b8 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_d0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_238;
    local_c0 = local_d0;
    local_b0 = local_c8;
    local_a8 = local_d0;
    ::fmt::v10::vformat_abi_cxx11_(&local_2d8,local_240,fmt,args);
    Error::Error(&local_2b8,kInvalidState,&local_2d8);
    Error::operator=(__return_storage_ptr__,&local_2b8);
    Error::~Error(&local_2b8);
    std::__cxx11::string::~string((string *)&local_2d8);
  }
  return __return_storage_ptr__;
}

Assistant:

Error DtlsSession::Write(const ByteArray &aBuf, MessageSubType aSubType)
{
    int   rval = 0;
    Error error;

    VerifyOrExit(mState == State::kConnected, error = ERROR_INVALID_STATE("the DTLS session is not connected"));

    mSocket->SetSubType(aSubType);
    rval = mbedtls_ssl_write(&mSsl, &aBuf[0], aBuf.size());
    mSocket->SetSubType(MessageSubType::kNone);

    if (rval >= 0)
    {
        VerifyOrExit(static_cast<size_t>(rval) == aBuf.size(),
                     error = ERROR_IO_BUSY("written {} bytes of total length {}", rval, aBuf.size()));

        LOG_DEBUG(LOG_REGION_DTLS, "session(={}) successfully write data: len={}, {}", static_cast<void *>(this),
                  aBuf.size(), utils::Hex(aBuf));
    }
    else
    {
        error = ErrorFromMbedtlsError(rval);
    }

exit:
    return error;
}